

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,Style style,Twine *a,Twine *b,Twine *c,Twine *d)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  size_type sVar4;
  ulong uVar5;
  long lVar6;
  StringRef *component;
  StringRef *this;
  undefined1 local_178 [8];
  SmallString<32U> a_storage;
  SmallString<32U> b_storage;
  SmallString<32U> c_storage;
  SmallString<32U> d_storage;
  SmallVector<llvm::StringRef,_4U> components;
  Twine local_58;
  char *local_40;
  undefined4 local_38;
  Style local_34;
  
  local_178 = (undefined1  [8])
              &a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.Size;
  a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  a_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size;
  b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size;
  c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size;
  d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       &components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       (void *)0x400000000;
  local_34 = style;
  if (EmptyKind < a->LHSKind) {
    local_58._0_16_ = Twine::toStringRef(a,(SmallVectorImpl<char> *)local_178);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_58);
  }
  if (EmptyKind < b->LHSKind) {
    local_58._0_16_ =
         Twine::toStringRef(b,(SmallVectorImpl<char> *)
                              (a_storage.super_SmallVector<char,_32U>.
                               super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_58);
  }
  if (EmptyKind < c->LHSKind) {
    local_58._0_16_ =
         Twine::toStringRef(c,(SmallVectorImpl<char> *)
                              (b_storage.super_SmallVector<char,_32U>.
                               super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_58);
  }
  if (EmptyKind < d->LHSKind) {
    local_58._0_16_ =
         Twine::toStringRef(d,(SmallVectorImpl<char> *)
                              (c_storage.super_SmallVector<char,_32U>.
                               super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)
               (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                InlineElts + 0x18),(StringRef *)&local_58);
  }
  local_40 = "/";
  if (local_34 == windows) {
    local_40 = "\\/";
  }
  local_38 = 0x2f;
  if (local_34 == windows) {
    local_38 = 0x5c;
  }
  lVar6 = ((ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX & 0xffffffff) << 4;
  this = (StringRef *)
         d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
         _24_8_;
  do {
    if (lVar6 == 0) {
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                ((SmallVectorImpl<llvm::StringRef> *)
                 (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                  InlineElts + 0x18));
      SmallVectorImpl<char>::~SmallVectorImpl
                ((SmallVectorImpl<char> *)
                 (c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                  InlineElts + 0x18));
      SmallVectorImpl<char>::~SmallVectorImpl
                ((SmallVectorImpl<char> *)
                 (b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                  InlineElts + 0x18));
      SmallVectorImpl<char>::~SmallVectorImpl
                ((SmallVectorImpl<char> *)
                 (a_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                  InlineElts + 0x18));
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_178);
      return;
    }
    uVar5 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    if (uVar5 == 0) {
LAB_00dbe1e2:
      if (this->Length == 0) {
LAB_00dbe207:
        if ((path->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) {
          Twine::Twine(&local_58,this);
          bVar2 = has_root_name(&local_58,local_34);
          if (!bVar2) {
            local_58.LHS.character = (char)local_38;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&path->super_SmallVectorTemplateBase<char,_true>,(char *)&local_58);
          }
        }
      }
      else {
        cVar1 = StringRef::operator[](this,0);
        if ((cVar1 != '/') && (local_34 != windows || cVar1 != '\\')) goto LAB_00dbe207;
      }
      SmallVectorImpl<char>::append<char_const*,void>(path,this->Data,this->Data + this->Length);
    }
    else {
      pcVar3 = SmallVectorTemplateCommon<char,_void>::operator[]
                         ((SmallVectorTemplateCommon<char,_void> *)path,uVar5 - 1);
      if ((*pcVar3 != '/') && (local_34 != windows || *pcVar3 != '\\')) goto LAB_00dbe1e2;
      StringRef::StringRef
                ((StringRef *)
                 (components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].buffer + 8)
                 ,local_40);
      sVar4 = StringRef::find_first_not_of(this,stack0xffffffffffffff98,0);
      uVar5 = this->Length;
      if (uVar5 < sVar4) {
        sVar4 = uVar5;
      }
      SmallVectorImpl<char>::append<char_const*,void>(path,this->Data + sVar4,this->Data + uVar5);
    }
    this = this + 1;
    lVar6 = lVar6 + -0x10;
  } while( true );
}

Assistant:

void append(SmallVectorImpl<char> &path, Style style, const Twine &a,
            const Twine &b, const Twine &c, const Twine &d) {
  SmallString<32> a_storage;
  SmallString<32> b_storage;
  SmallString<32> c_storage;
  SmallString<32> d_storage;

  SmallVector<StringRef, 4> components;
  if (!a.isTriviallyEmpty()) components.push_back(a.toStringRef(a_storage));
  if (!b.isTriviallyEmpty()) components.push_back(b.toStringRef(b_storage));
  if (!c.isTriviallyEmpty()) components.push_back(c.toStringRef(c_storage));
  if (!d.isTriviallyEmpty()) components.push_back(d.toStringRef(d_storage));

  for (auto &component : components) {
    bool path_has_sep =
        !path.empty() && is_separator(path[path.size() - 1], style);
    if (path_has_sep) {
      // Strip separators from beginning of component.
      size_t loc = component.find_first_not_of(separators(style));
      StringRef c = component.substr(loc);

      // Append it.
      path.append(c.begin(), c.end());
      continue;
    }

    bool component_has_sep =
        !component.empty() && is_separator(component[0], style);
    if (!component_has_sep &&
        !(path.empty() || has_root_name(component, style))) {
      // Add a separator.
      path.push_back(preferred_separator(style));
    }

    path.append(component.begin(), component.end());
  }
}